

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
          (DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *this)

{
  uint uVar1;
  Entry *pEVar2;
  Entry *pe;
  uint oldTS;
  DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *this_local;
  
  uVar1 = this->_timestamp;
  this->_timestamp = this->_timestamp + 1;
  this->_size = 0;
  this->_deleted = 0;
  if ((this->_timestamp & 0x3fffffff) < uVar1) {
    this->_timestamp = 1;
    pe = this->_afterLast;
    while (pEVar2 = pe + -1, pe != this->_entries) {
      (pEVar2->field_0)._infoData = (pEVar2->field_0)._infoData & 3;
      pe = pEVar2;
    }
  }
  return;
}

Assistant:

void reset()
  {
    unsigned oldTS=_timestamp;
    _timestamp++;
    _size=0;
    _deleted=0;

    if(oldTS>(_timestamp&0x3FFFFFFF)) {
      //We store timestamp only in 30 bits in entries,
      //and they've just overflowed.
      _timestamp=1;
      Entry* pe=_afterLast;
      while(pe--!=_entries) {
	pe->_info.timestamp=0;
      }
    }
  }